

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_context.c
# Opt level: O0

SUNErrCode SUNContext_PopErrHandler(SUNContext sunctx)

{
  long in_RDI;
  SUNErrHandler_conflict eh;
  SUNContext sunctx_local_scope_;
  undefined4 local_4;
  
  if (in_RDI == 0) {
    local_4 = -0x26fa;
  }
  else {
    if (*(long *)(in_RDI + 0x20) != 0) {
      if (**(long **)(in_RDI + 0x20) == 0) {
        *(undefined8 *)(in_RDI + 0x20) = 0;
      }
      else {
        *(undefined8 *)(in_RDI + 0x20) = **(undefined8 **)(in_RDI + 0x20);
      }
      SUNErrHandler_Destroy((SUNErrHandler *)0x106dac);
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

SUNErrCode SUNContext_PopErrHandler(SUNContext sunctx)
{
  if (!sunctx) { return SUN_ERR_SUNCTX_CORRUPT; }

  SUNFunctionBegin(sunctx);
  if (sunctx->err_handler)
  {
    SUNErrHandler eh = sunctx->err_handler;
    if (sunctx->err_handler->previous)
    {
      sunctx->err_handler = sunctx->err_handler->previous;
    }
    else { sunctx->err_handler = NULL; }
    SUNErrHandler_Destroy(&eh);
  }
  return SUN_SUCCESS;
}